

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O3

int create_pa_stream(cubeb_stream_conflict *stm,pa_stream **pa_stm,
                    cubeb_stream_params *stream_params,char *stream_name)

{
  uint uVar1;
  cubeb_log_level cVar2;
  cubeb_channel_layout layout;
  pa_channel_map *ppVar3;
  cubeb_log_callback p_Var4;
  pa_stream *ppVar5;
  pa_context *ppVar6;
  pa_sample_spec ss;
  pa_channel_map cm;
  pa_sample_spec local_b0;
  pa_channel_map local_a4;
  
  if ((&stm->input_stream != pa_stm) &&
     ((&stm->output_stream != pa_stm ||
      ((stream_params->layout != 0 &&
       (uVar1 = cubeb_channel_layout_nb_channels(stream_params->layout),
       uVar1 != stream_params->channels)))))) {
    __assert_fail("&stm->input_stream == pa_stm || (&stm->output_stream == pa_stm && (stream_params->layout == CUBEB_LAYOUT_UNDEFINED || (stream_params->layout != CUBEB_LAYOUT_UNDEFINED && cubeb_channel_layout_nb_channels(stream_params->layout) == stream_params->channels)))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_pulse.c"
                  ,0x368,
                  "int create_pa_stream(cubeb_stream *, pa_stream **, cubeb_stream_params *, const char *)"
                 );
  }
  if ((stream_params->prefs & CUBEB_STREAM_PREF_LOOPBACK) != CUBEB_STREAM_PREF_NONE) {
    return -4;
  }
  *pa_stm = (pa_stream *)0x0;
  if (CUBEB_SAMPLE_FLOAT32BE < stream_params->format) {
    return -2;
  }
  local_b0.format = stream_params->format + CUBEB_SAMPLE_FLOAT32BE;
  local_b0.rate = stream_params->rate;
  uVar1 = stream_params->channels;
  if (0xff < uVar1) {
    return -2;
  }
  local_b0.channels = (uint8_t)uVar1;
  layout = stream_params->layout;
  if (layout == 0) {
    if ((8 < uVar1) ||
       (ppVar3 = (*cubeb_pa_channel_map_init_auto)(&local_a4,uVar1,PA_CHANNEL_MAP_AIFF),
       ppVar3 != (pa_channel_map *)0x0)) {
      cVar2 = cubeb_log_get_level();
      if ((cVar2 != CUBEB_LOG_DISABLED) &&
         (p_Var4 = cubeb_log_get_callback(), p_Var4 != (cubeb_log_callback)0x0)) {
        cubeb_log_internal("cubeb_pulse.c",0x382,
                           "Layout undefined, PulseAudio will use its default.");
      }
      ppVar6 = stm->context->context;
      ppVar3 = (pa_channel_map *)0x0;
      goto LAB_0010d24f;
    }
    cVar2 = cubeb_log_get_level();
    if ((cVar2 != CUBEB_LOG_DISABLED) &&
       (p_Var4 = cubeb_log_get_callback(), p_Var4 != (cubeb_log_callback)0x0)) {
      cubeb_log_internal("cubeb_pulse.c",0x37c,
                         "Layout undefined and PulseAudio\'s default layout has not been configured, guess one."
                        );
    }
    layout = pulse_default_layout_for_channels(stream_params->channels);
  }
  ppVar3 = &local_a4;
  layout_to_channel_map(layout,ppVar3);
  ppVar6 = stm->context->context;
LAB_0010d24f:
  ppVar5 = (*cubeb_pa_stream_new)(ppVar6,stream_name,&local_b0,ppVar3);
  *pa_stm = ppVar5;
  return -(uint)(ppVar5 == (pa_stream *)0x0);
}

Assistant:

static int
create_pa_stream(cubeb_stream * stm, pa_stream ** pa_stm,
                 cubeb_stream_params * stream_params, char const * stream_name)
{
  assert(stm && stream_params);
  assert(&stm->input_stream == pa_stm ||
         (&stm->output_stream == pa_stm &&
          (stream_params->layout == CUBEB_LAYOUT_UNDEFINED ||
           (stream_params->layout != CUBEB_LAYOUT_UNDEFINED &&
            cubeb_channel_layout_nb_channels(stream_params->layout) ==
                stream_params->channels))));
  if (stream_params->prefs & CUBEB_STREAM_PREF_LOOPBACK) {
    return CUBEB_ERROR_NOT_SUPPORTED;
  }
  *pa_stm = NULL;
  pa_sample_spec ss;
  ss.format = to_pulse_format(stream_params->format);
  if (ss.format == PA_SAMPLE_INVALID)
    return CUBEB_ERROR_INVALID_FORMAT;
  ss.rate = stream_params->rate;
  if (stream_params->channels > UINT8_MAX)
    return CUBEB_ERROR_INVALID_FORMAT;
  ss.channels = (uint8_t)stream_params->channels;

  if (stream_params->layout == CUBEB_LAYOUT_UNDEFINED) {
    pa_channel_map cm;
    if (stream_params->channels <= 8 &&
        !WRAP(pa_channel_map_init_auto)(&cm, stream_params->channels,
                                        PA_CHANNEL_MAP_DEFAULT)) {
      LOG("Layout undefined and PulseAudio's default layout has not been "
          "configured, guess one.");
      layout_to_channel_map(
          pulse_default_layout_for_channels(stream_params->channels), &cm);
      *pa_stm =
          WRAP(pa_stream_new)(stm->context->context, stream_name, &ss, &cm);
    } else {
      LOG("Layout undefined, PulseAudio will use its default.");
      *pa_stm =
          WRAP(pa_stream_new)(stm->context->context, stream_name, &ss, NULL);
    }
  } else {
    pa_channel_map cm;
    layout_to_channel_map(stream_params->layout, &cm);
    *pa_stm = WRAP(pa_stream_new)(stm->context->context, stream_name, &ss, &cm);
  }
  return (*pa_stm == NULL) ? CUBEB_ERROR : CUBEB_OK;
}